

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

long __thiscall FString::LastIndexOf(FString *this,char *substr,long endIndex)

{
  size_t substrlen;
  long lVar1;
  long endIndex_local;
  char *substr_local;
  FString *this_local;
  
  substrlen = strlen(substr);
  lVar1 = LastIndexOf(this,substr,endIndex,substrlen);
  return lVar1;
}

Assistant:

long FString::LastIndexOf (const char *substr, long endIndex) const
{
	return LastIndexOf (substr, endIndex, strlen(substr));
}